

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_7(void)

{
  wchar_t wVar1;
  int iVar2;
  int local_34;
  size_t sStack_30;
  int i;
  size_t s;
  void *p;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_1467e;
  extract_reference_file("test_compat_zip_7.xps");
  s = (size_t)slurpfile(&stack0xffffffffffffffd0,"%s",a);
  for (local_34 = 1; local_34 < 1000; local_34 = local_34 + 1) {
    ae = (archive_entry *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                     ,L'Ɨ',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    wVar1 = archive_read_support_format_zip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ƙ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",ae);
    iVar2 = read_open_memory_minimal((archive *)ae,(void *)s,sStack_30,(long)local_34);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƙ',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_minimal(a, p, s, i)",ae)
    ;
    iVar2 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƛ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
    iVar2 = archive_read_data_skip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ɯ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",ae);
    iVar2 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ɲ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
    iVar2 = archive_read_data_skip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƞ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",ae);
    iVar2 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ɵ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
    iVar2 = archive_read_data_skip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ơ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",ae);
    iVar2 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ơ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",ae);
    iVar2 = archive_read_data_skip((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ƣ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",ae);
    iVar2 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ƥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",ae);
  }
  free((void *)s);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_7)
{
	const char *refname = "test_compat_zip_7.xps";
	struct archive *a;
	struct archive_entry *ae;
	void *p;
	size_t s;
	int i;

	extract_reference_file(refname);
	p = slurpfile(&s, "%s", refname);

	for (i = 1; i < 1000; ++i) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
		assertEqualIntA(a, ARCHIVE_OK, read_open_memory_minimal(a, p, s, i));

		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));

		assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	}
	free(p);
}